

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O0

void __thiscall
dynet::PickElement::backward_dev_impl<dynet::Device_CPU>
          (PickElement *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  invalid_argument *this_00;
  TensorBase<Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
  *pTVar1;
  const_reference ppTVar2;
  TensorBase<Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
  *this_01;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  long in_RDI;
  int in_R9D;
  uint b;
  ostringstream oss;
  DefaultDevice *in_stack_fffffffffffffba8;
  TensorBase<Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
  *in_stack_fffffffffffffbb0;
  Index in_stack_fffffffffffffbb8;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffbc0;
  ostringstream *this_02;
  Tensor *in_stack_fffffffffffffbd0;
  Tensor *in_stack_fffffffffffffbf0;
  TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>
  *in_stack_fffffffffffffc38;
  TensorDevice<Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffc40;
  TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>
  *in_stack_fffffffffffffc58;
  TensorDevice<Eigen::TensorChippingOp<_1L,_Eigen::TensorChippingOp<3L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffc60;
  uint local_274;
  string local_1d8 [48];
  ostringstream local_1a8 [400];
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *local_18;
  
  if (in_R9D == 0) {
    if (*(long *)(in_RDI + 0x68) == 0) {
      local_274 = 0;
      local_18 = in_RDX;
      while( true ) {
        this_01 = (TensorBase<Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                   *)(ulong)local_274;
        pTVar1 = (TensorBase<Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                  *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                                (in_RDI + 0x88));
        if (pTVar1 <= this_01) break;
        ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::
                  operator[](local_18,0);
        if (((*ppTVar2)->d).bd == 1) {
          Tensor::tb<2>(in_stack_fffffffffffffbd0);
          Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,1>
          ::chip<2l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_1>
                      *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          Tensor::t<3>(in_stack_fffffffffffffbf0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x88),
                     (ulong)local_274);
          Eigen::
          TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_1>::
          chip((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_1>
                *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,(Index)this_01);
          Eigen::
          TensorBase<Eigen::TensorChippingOp<-1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
          ::device<Eigen::DefaultDevice>(this_01,in_stack_fffffffffffffba8);
          Eigen::
          TensorDevice<Eigen::TensorChippingOp<-1l,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
          ::operator+=((TensorDevice<Eigen::TensorChippingOp<_1L,_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
                        *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        }
        else {
          Tensor::tb<2>(in_stack_fffffffffffffbd0);
          Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,1>
          ::chip<2l>((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_1>
                      *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          Tensor::tb<3>(in_stack_fffffffffffffbf0);
          Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,4,0,long>,0,Eigen::MakePointer>,1>
          ::chip<3l>(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x88),
                     (ulong)local_274);
          Eigen::
          TensorBase<Eigen::TensorChippingOp<3L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
          ::chip((TensorBase<Eigen::TensorChippingOp<3L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
                  *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,(Index)this_01);
          Eigen::
          TensorBase<Eigen::TensorChippingOp<-1L,_Eigen::TensorChippingOp<3L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>_>,_1>
          ::device<Eigen::DefaultDevice>
                    ((TensorBase<Eigen::TensorChippingOp<_1L,_Eigen::TensorChippingOp<3L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>_>,_1>
                      *)this_01,in_stack_fffffffffffffba8);
          Eigen::
          TensorDevice<Eigen::TensorChippingOp<-1l,Eigen::TensorChippingOp<3l,Eigen::TensorMap<Eigen::Tensor<float,4,0,long>,0,Eigen::MakePointer>>>,Eigen::DefaultDevice>
          ::operator+=(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        }
        local_274 = local_274 + 1;
      }
    }
    else {
      Tensor::tb<2>(in_stack_fffffffffffffbd0);
      Tensor::tb<3>(in_stack_fffffffffffffbf0);
      Eigen::
      TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>,_1>::chip
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 (Index)in_stack_fffffffffffffbb0);
      Eigen::
      TensorBase<Eigen::TensorChippingOp<-1L,_Eigen::TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
      ::device<Eigen::DefaultDevice>(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      Eigen::
      TensorDevice<Eigen::TensorChippingOp<-1l,Eigen::TensorMap<Eigen::Tensor<float,4,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
      ::operator+=(in_stack_fffffffffffffc40,&in_stack_fffffffffffffc38->m_xpr);
    }
    return;
  }
  this_02 = local_1a8;
  std::__cxx11::ostringstream::ostringstream(this_02);
  std::operator<<((ostream *)this_02,"Failed dimension check in PickElement::backward");
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_1d8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void PickElement::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  DYNET_ARG_CHECK(i == 0, "Failed dimension check in PickElement::backward");
  if(pval) {
    dEdxi.tb<3>().chip(*pval, dimension).device(*dev.edevice) += dEdf.tb<2>();
  } else {
    DYNET_ASSERT(pvals, "Neither single nor vector of elements available in PickElement::forward");
    for(unsigned b = 0; b < pvals->size(); ++b){
      if(xs[0]->d.bd == 1){
        dEdxi.t<3>().chip((*pvals)[b], dimension).device(*dev.edevice) += dEdf.tb<2>().chip<2>(b);
      }else{
        dEdxi.tb<3>().chip<3>(b).chip((*pvals)[b], dimension).device(*dev.edevice) += dEdf.tb<2>().chip<2>(b);
      }
    }
  }
}